

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

int __thiscall HModel::util_chgColBoundsAll(HModel *this,double *XcolLower,double *XcolUpper)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  int iVar4;
  ulong in_RAX;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  
  iVar4 = (int)in_RAX;
  uVar5 = (ulong)this->numCol;
  bVar8 = 0 < (long)uVar5;
  if (0 < (long)uVar5) {
    pdVar1 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    uVar6 = 1;
    do {
      dVar11 = XcolLower[uVar6 - 1];
      if (1e+200 <= dVar11) {
        bVar9 = false;
        in_RAX = uVar6 & 0xffffffff;
      }
      else {
        dVar10 = XcolUpper[uVar6 - 1];
        if (dVar10 <= -1e+200) {
          in_RAX = (ulong)~uVar7;
          bVar9 = false;
        }
        else {
          if (-1e+200 < dVar11) {
            dVar11 = dVar11 / pdVar1[uVar6 - 1];
          }
          pdVar2[uVar6 - 1] = dVar11;
          if (dVar10 < 1e+200) {
            dVar10 = dVar10 / pdVar1[uVar6 - 1];
          }
          pdVar3[uVar6 - 1] = dVar10;
          bVar9 = true;
        }
      }
      iVar4 = (int)in_RAX;
      if (!bVar9) break;
      uVar7 = uVar7 + 1;
      bVar8 = uVar6 < uVar5;
      bVar9 = uVar6 != uVar5;
      uVar6 = uVar6 + 1;
    } while (bVar9);
  }
  if (!bVar8) {
    mlFg_Update(this,this->mlFg_action_NewBounds);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int HModel::util_chgColBoundsAll(const double* XcolLower, const double* XcolUpper) {
  assert(XcolLower != NULL);
  assert(XcolUpper != NULL);
  for (int col = 0; col < numCol; ++col) {
    double lower = XcolLower[col];
    double upper = XcolUpper[col];
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(lower)) return col+1;
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(-upper)) return -(col+1);
    assert(lower<=upper);
    colLower[col] = (hsol_isInfinity(-lower) ? lower : lower / colScale[col]);
    colUpper[col] = (hsol_isInfinity( upper) ? upper : upper / colScale[col]);
    //    printf("[LB; Pr; UB] for column %2d are now [%11g, %11g, %11g] Dual = %g\n", col, colLower[col], workValue[col], colUpper[col], workDual[col]);
  }
  //Deduce the consequences of new bounds
  mlFg_Update(mlFg_action_NewBounds);
  return 0;
}